

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main() {
    assert(concat() == make_tuple());
    assert(concat(make_tuple(1, 2)) == make_tuple(1, 2));
    assert(concat(make_tuple(1, 2), make_tuple(3, 4)) ==
           make_tuple(1, 2, 3, 4));
    assert(concat(make_tuple(1), make_tuple(),
                  make_tuple(2), make_tuple(3),
                  make_tuple(),
                  make_tuple(4)) == make_tuple(1, 2, 3, 4));
}